

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_3>_> __thiscall
vkt::shaderexecutor::
createApply<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (shaderexecutor *this,
          Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *func,ExprP<tcu::Vector<float,_3>_> *arg0,ExprP<vkt::shaderexecutor::Void> *arg1,
          ExprP<vkt::shaderexecutor::Void> *arg2,ExprP<vkt::shaderexecutor::Void> *arg3)

{
  Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  ExprP<vkt::shaderexecutor::Void> *arg3_local;
  ExprP<vkt::shaderexecutor::Void> *arg2_local;
  ExprP<vkt::shaderexecutor::Void> *arg1_local;
  ExprP<tcu::Vector<float,_3>_> *arg0_local;
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func_local;
  
  this_00 = (Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *)operator_new(0x50);
  Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<tcu::Vector<float,3>>(this,(Expr<tcu::Vector<float,_3>_> *)this_00);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}